

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<VCFilter>::emplace<VCFilter_const&>
          (QGenericArrayOps<VCFilter> *this,qsizetype i,VCFilter *args)

{
  VCFilter **ppVVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_4c8;
  VCFilter tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<VCFilter>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<VCFilter>).size == i) {
      qVar5 = QArrayDataPointer<VCFilter>::freeSpaceAtEnd(&this->super_QArrayDataPointer<VCFilter>);
      if (qVar5 == 0) goto LAB_001d6896;
      VCFilter::VCFilter((this->super_QArrayDataPointer<VCFilter>).ptr +
                         (this->super_QArrayDataPointer<VCFilter>).size,args);
LAB_001d69b6:
      pqVar2 = &(this->super_QArrayDataPointer<VCFilter>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_001d6968;
    }
LAB_001d6896:
    if (i == 0) {
      qVar5 = QArrayDataPointer<VCFilter>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<VCFilter>);
      if (qVar5 != 0) {
        VCFilter::VCFilter((this->super_QArrayDataPointer<VCFilter>).ptr + -1,args);
        ppVVar1 = &(this->super_QArrayDataPointer<VCFilter>).ptr;
        *ppVVar1 = *ppVVar1 + -1;
        goto LAB_001d69b6;
      }
    }
  }
  memset(&tmp,0xaa,0x448);
  VCFilter::VCFilter(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<VCFilter>).size != 0;
  QArrayDataPointer<VCFilter>::detachAndGrow
            (&this->super_QArrayDataPointer<VCFilter>,(uint)(i == 0 && bVar6),1,(VCFilter **)0x0,
             (QArrayDataPointer<VCFilter> *)0x0);
  if (i == 0 && bVar6) {
    VCFilter::VCFilter((this->super_QArrayDataPointer<VCFilter>).ptr + -1,&tmp);
    ppVVar1 = &(this->super_QArrayDataPointer<VCFilter>).ptr;
    *ppVVar1 = *ppVVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<VCFilter>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_4c8.sourceCopyConstruct = 0;
    local_4c8.nSource = 0;
    local_4c8.move = 0;
    local_4c8.sourceCopyAssign = 0;
    local_4c8.end = (VCFilter *)0x0;
    local_4c8.last = (VCFilter *)0x0;
    local_4c8.where = (VCFilter *)0x0;
    local_4c8.begin = (this->super_QArrayDataPointer<VCFilter>).ptr;
    local_4c8.size = (this->super_QArrayDataPointer<VCFilter>).size;
    local_4c8.data = &this->super_QArrayDataPointer<VCFilter>;
    Inserter::insertOne(&local_4c8,i,&tmp);
    (local_4c8.data)->ptr = local_4c8.begin;
    (local_4c8.data)->size = local_4c8.size;
  }
  VCFilter::~VCFilter(&tmp);
LAB_001d6968:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }